

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall mario::TimerQueue::TimerQueue(TimerQueue *this,EventLoop *loop)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  int fdArg;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this->_loop = loop;
  fdArg = detail::createTimerfd();
  this->_timerfd = fdArg;
  Channel::Channel(&this->_timerfdChannel,loop,fdArg);
  p_Var2 = &(this->_timers)._M_t._M_impl.super__Rb_tree_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_callingExpiredTimers = false;
  p_Var2 = &(this->_activeTimers)._M_t._M_impl.super__Rb_tree_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(code **)local_48._M_unused._0_8_ = handleRead;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(TimerQueue **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  pcStack_30 = std::
               _Function_handler<void_(mario::Timestamp),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*))()>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(mario::Timestamp),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*))()>_>
             ::_M_manager;
  std::function<void_(mario::Timestamp)>::operator=
            (&(this->_timerfdChannel)._readCallback,(function<void_(mario::Timestamp)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  piVar1 = &(this->_timerfdChannel)._events;
  *piVar1 = *piVar1 | 3;
  Channel::update(&this->_timerfdChannel);
  return;
}

Assistant:

TimerQueue::TimerQueue(EventLoop* loop)
    : _loop(loop)
    , _timerfd(createTimerfd()) 
    , _timerfdChannel(loop, _timerfd)
    , _timers()
    , _callingExpiredTimers(false)
{
    _timerfdChannel.setReadCallback(
            std::bind(&TimerQueue::handleRead, this)
        );
    _timerfdChannel.enableReading();
}